

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::if2ip(string *__return_storage_ptr__,int address_family,string *ifn)

{
  ushort *puVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_type *psVar5;
  long *plVar6;
  size_type sStack_b8;
  char buf [16];
  size_type local_88;
  size_type *local_80;
  size_type __dnew;
  size_type local_70 [2];
  long *local_60;
  ifaddrs *ifap;
  string addr_candidate;
  
  getifaddrs(&local_60);
  ifap = (ifaddrs *)&addr_candidate._M_string_length;
  addr_candidate._M_dataplus._M_p = (pointer)0x0;
  addr_candidate._M_string_length._0_1_ = 0;
  if (local_60 == (long *)0x0) {
    local_60 = (long *)0x0;
  }
  else {
    plVar6 = local_60;
    addr_candidate.field_2._8_8_ = __return_storage_ptr__;
    do {
      if ((plVar6[3] != 0) && (iVar2 = std::__cxx11::string::compare((char *)ifn), iVar2 == 0)) {
        puVar1 = (ushort *)plVar6[3];
        uVar3 = (uint)*puVar1;
        if ((address_family == 0) || (uVar3 == address_family)) {
          if (uVar3 == 10) {
            if ((*(uint *)(puVar1 + 4) & 0xc0ff) != 0x80fe) {
              buf[8] = '\0';
              buf[9] = '\0';
              buf[10] = '\0';
              buf[0xb] = '\0';
              buf[0xc] = '\0';
              buf[0xd] = '\0';
              buf[0xe] = '\0';
              buf[0xf] = '\0';
              sStack_b8 = 0;
              buf[0] = '\0';
              buf[1] = '\0';
              buf[2] = '\0';
              buf[3] = '\0';
              buf[4] = '\0';
              buf[5] = '\0';
              buf[6] = '\0';
              buf[7] = '\0';
              pcVar4 = inet_ntop(10,puVar1 + 4,(char *)&sStack_b8,0x2e);
              if (pcVar4 != (char *)0x0) {
                if ((puVar1[4] & 0xfe) != 0xfc) {
                  freeifaddrs(local_60);
                  __return_storage_ptr__ = (string *)addr_candidate.field_2._8_8_;
                  *(long *)addr_candidate.field_2._8_8_ = addr_candidate.field_2._8_8_ + 0x10;
                  local_80 = (size_type *)0x2e;
                  psVar5 = (size_type *)
                           std::__cxx11::string::_M_create
                                     ((ulong *)addr_candidate.field_2._8_8_,(ulong)&local_80);
                  *(size_type **)__return_storage_ptr__ = psVar5;
                  *(size_type **)((long)__return_storage_ptr__ + 0x10) = local_80;
                  *(undefined8 *)((long)psVar5 + 0x1e) = 0;
                  *(undefined8 *)((long)psVar5 + 0x26) = 0;
                  psVar5[2] = buf._8_8_;
                  psVar5[3] = 0;
                  *psVar5 = sStack_b8;
                  psVar5[1] = buf._0_8_;
                  *(size_type **)((long)__return_storage_ptr__ + 8) = local_80;
                  goto LAB_001b9dee;
                }
                local_80 = local_70;
                local_88 = 0x2e;
                local_80 = (size_type *)
                           std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
                local_70[0] = local_88;
                *(undefined8 *)((long)local_80 + 0x1e) = 0;
                *(undefined8 *)((long)local_80 + 0x26) = 0;
                local_80[2] = buf._8_8_;
                local_80[3] = 0;
                *local_80 = sStack_b8;
                local_80[1] = buf._0_8_;
                __dnew = local_88;
                *(undefined1 *)((long)local_80 + local_88) = 0;
                std::__cxx11::string::operator=((string *)&ifap,(string *)&local_80);
                if (local_80 != local_70) {
                  operator_delete(local_80,local_70[0] + 1);
                }
              }
            }
          }
          else if ((uVar3 == 2) &&
                  (pcVar4 = inet_ntop(2,puVar1 + 2,(char *)&sStack_b8,0x10), pcVar4 != (char *)0x0))
          {
            freeifaddrs(local_60);
            __return_storage_ptr__ = (string *)addr_candidate.field_2._8_8_;
            *(long *)addr_candidate.field_2._8_8_ = addr_candidate.field_2._8_8_ + 0x10;
            local_80 = (size_type *)0x10;
            psVar5 = (size_type *)
                     std::__cxx11::string::_M_create
                               ((ulong *)addr_candidate.field_2._8_8_,(ulong)&local_80);
            *(size_type **)__return_storage_ptr__ = psVar5;
            *(size_type **)((long)__return_storage_ptr__ + 0x10) = local_80;
            *psVar5 = sStack_b8;
            psVar5[1] = buf._0_8_;
            *(size_type **)((long)__return_storage_ptr__ + 8) = local_80;
            psVar5 = *(size_type **)__return_storage_ptr__;
LAB_001b9dee:
            *(undefined1 *)((long)psVar5 + (long)local_80) = 0;
            goto LAB_001b9d1d;
          }
        }
      }
      plVar6 = (long *)*plVar6;
      __return_storage_ptr__ = (string *)addr_candidate.field_2._8_8_;
    } while (plVar6 != (long *)0x0);
  }
  freeifaddrs(local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ifap == (ifaddrs *)&addr_candidate._M_string_length) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(addr_candidate._M_string_length._1_7_,(undefined1)addr_candidate._M_string_length)
    ;
    *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
         addr_candidate.field_2._M_allocated_capacity;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)ifap;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(addr_candidate._M_string_length._1_7_,(undefined1)addr_candidate._M_string_length)
    ;
  }
  __return_storage_ptr__->_M_string_length = (size_type)addr_candidate._M_dataplus._M_p;
  addr_candidate._M_dataplus._M_p = (pointer)0x0;
  addr_candidate._M_string_length._0_1_ = 0;
  ifap = (ifaddrs *)&addr_candidate._M_string_length;
LAB_001b9d1d:
  if (ifap != (ifaddrs *)&addr_candidate._M_string_length) {
    operator_delete(ifap,CONCAT71(addr_candidate._M_string_length._1_7_,
                                  (undefined1)addr_candidate._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(int address_family, const std::string& ifn) {
            struct ifaddrs* ifap;
            getifaddrs(&ifap);
            std::string addr_candidate;
            for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
                if (ifa->ifa_addr && ifn == ifa->ifa_name &&
                    (AF_UNSPEC == address_family ||
                        ifa->ifa_addr->sa_family == address_family)) {
                    if (ifa->ifa_addr->sa_family == AF_INET) {
                        auto sa = reinterpret_cast<struct sockaddr_in*>(ifa->ifa_addr);
                        char buf[INET_ADDRSTRLEN];
                        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
                            freeifaddrs(ifap);
                            return std::string(buf, INET_ADDRSTRLEN);
                        }
                    } else if (ifa->ifa_addr->sa_family == AF_INET6) {
                        auto sa = reinterpret_cast<struct sockaddr_in6*>(ifa->ifa_addr);
                        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
                            char buf[INET6_ADDRSTRLEN] = {};
                            if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
                                // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
                                auto s6_addr_head = sa->sin6_addr.s6_addr[0];
                                if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
                                    addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
                                } else {
                                    freeifaddrs(ifap);
                                    return std::string(buf, INET6_ADDRSTRLEN);
                                }
                            }
                        }
                    }
                }
            }
            freeifaddrs(ifap);
            return addr_candidate;
        }